

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgroupbox.cpp
# Opt level: O0

void __thiscall QGroupBox::mousePressEvent(QGroupBox *this,QMouseEvent *event)

{
  MouseButton MVar1;
  SubControl SVar2;
  Int IVar3;
  QGroupBoxPrivate *pQVar4;
  QWidget *this_00;
  QStyle *pQVar5;
  QSinglePointEvent *in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  bool bVar6;
  QGroupBoxPrivate *d;
  QStyleOptionGroupBox box;
  undefined4 in_stack_fffffffffffffef8;
  QFlagsStorage<QStyle::SubControl> in_stack_fffffffffffffefc;
  enum_type in_stack_ffffffffffffff00;
  enum_type in_stack_ffffffffffffff04;
  undefined7 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff17;
  QFlagsStorageHelper<QStyle::SubControl,_4> local_ac;
  QPointF local_a8;
  QPoint local_98;
  undefined1 local_90 [136];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  MVar1 = QSinglePointEvent::button(in_RSI);
  if (MVar1 == LeftButton) {
    pQVar4 = d_func((QGroupBox *)0x5a53a8);
    memset(local_90,0xaa,0x88);
    QStyleOptionGroupBox::QStyleOptionGroupBox((QStyleOptionGroupBox *)0x5a53cb);
    (**(code **)(*in_RDI + 0x1a0))(in_RDI,local_90);
    this_00 = (QWidget *)
              QWidget::style((QWidget *)
                             CONCAT44(in_stack_fffffffffffffefc.i,in_stack_fffffffffffffef8));
    local_a8 = QSinglePointEvent::position((QSinglePointEvent *)0x5a53f7);
    local_98 = QPointF::toPoint((QPointF *)
                                CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
    SVar2 = (**(code **)(*(long *)this_00 + 0xd0))(this_00,7,local_90,&local_98,in_RDI);
    pQVar4->pressedControl = SVar2;
    bVar6 = false;
    if ((pQVar4->checkable & 1U) != 0) {
      in_stack_ffffffffffffff04 = pQVar4->pressedControl;
      ::operator|(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00);
      local_ac.super_QFlagsStorage<QStyle::SubControl>.i =
           (QFlagsStorage<QStyle::SubControl>)
           ::operator&(SC_None,(QFlags<QStyle::SubControl>)in_stack_fffffffffffffefc.i);
      IVar3 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_ac);
      bVar6 = IVar3 != 0;
    }
    if (bVar6) {
      pQVar4->overCheckBox = true;
      pQVar5 = QWidget::style((QWidget *)
                              CONCAT44(in_stack_fffffffffffffefc.i,in_stack_fffffffffffffef8));
      (**(code **)(*(long *)pQVar5 + 0xd8))(pQVar5,7,local_90,1,in_RDI);
      QWidget::update(this_00,(QRect *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00)
                     );
    }
    else {
      QEvent::ignore((QEvent *)in_RSI);
    }
    QStyleOptionGroupBox::~QStyleOptionGroupBox
              ((QStyleOptionGroupBox *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00)
              );
  }
  else {
    QEvent::ignore((QEvent *)in_RSI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGroupBox::mousePressEvent(QMouseEvent *event)
{
    if (event->button() != Qt::LeftButton) {
        event->ignore();
        return;
    }

    Q_D(QGroupBox);
    QStyleOptionGroupBox box;
    initStyleOption(&box);
    d->pressedControl = style()->hitTestComplexControl(QStyle::CC_GroupBox, &box,
                                                       event->position().toPoint(), this);
    if (d->checkable && (d->pressedControl & (QStyle::SC_GroupBoxCheckBox | QStyle::SC_GroupBoxLabel))) {
        d->overCheckBox = true;
        update(style()->subControlRect(QStyle::CC_GroupBox, &box, QStyle::SC_GroupBoxCheckBox, this));
    } else {
        event->ignore();
    }
}